

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)78,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)2,_2> src;
  u32 local_3c;
  ushort local_38;
  
  uVar1 = dasmIncRead<2>(this,addr);
  local_38 = op & 7;
  local_3c = *addr;
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)2,_2> *)&local_3c);
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(RegRegList)(u16)uVar1);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = RegRegList ( (u16)dasmIncRead<Word>(addr)  );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}